

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

bool __thiscall flatbuffers::jsons::JsonSchemaGenerator::save(JsonSchemaGenerator *this)

{
  bool bVar1;
  string file_path;
  string local_30;
  
  GeneratedFileName(&local_30,this,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_,
                    &((this->super_BaseGenerator).parser_)->opts);
  bVar1 = SaveFile(local_30._M_dataplus._M_p,&this->code_,false);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool save() const {
    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    return SaveFile(file_path.c_str(), code_, false);
  }